

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainReal.c
# Opt level: O1

int Abc_RealMain(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Vec_Str_t *p;
  char *pcVar10;
  Abc_Frame_t *pAbc;
  char *pcVar11;
  char *pcVar12;
  Gia_Man_t *pGVar13;
  size_t sVar14;
  ulong uVar15;
  __rlimit_resource_t __resource;
  char *pcVar16;
  size_t sVar17;
  int i;
  long lVar18;
  char sWriteCmd [1000];
  char sReadCmd [1000];
  char sCommandTmp [32768];
  char *local_8820;
  char local_8818 [1008];
  char local_8428 [1008];
  rlimit local_8038 [2048];
  
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pcVar10 = (char *)malloc(1000);
  p->pArray = pcVar10;
  pAbc = Abc_FrameGetGlobalFrame();
  pAbc->sBinary = *argv;
  builtin_strncpy(local_8428,"read",5);
  builtin_strncpy(local_8818,"write",6);
  Extra_UtilGetoptReset();
  bVar3 = false;
  bVar4 = false;
  iVar7 = 0;
  local_8820 = (char *)0x0;
  bVar5 = true;
switchD_001c9df6_caseD_73:
  while (bVar2 = bVar5, iVar8 = argc,
        iVar6 = Extra_UtilGetopt(argc,argv,"dm:l:c:q:C:Q:S:hf:F:o:st:T:xb"), bVar5 = bVar2,
        iVar6 < 0x53) {
    if (iVar6 < 0x46) {
      pcVar10 = " ; ";
      if (iVar6 != 0x43) {
        if (iVar6 == -1) {
          uVar9 = p->nCap;
          if (p->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              pcVar11 = p->pArray;
              if (pcVar11 == (char *)0x0) {
                iVar8 = 0x10;
                pcVar12 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = &DAT_00000010;
                pcVar12 = (char *)realloc(pcVar11,0x10);
                iVar8 = (int)pcVar11;
              }
              pcVar11 = &DAT_00000010;
            }
            else {
              pcVar11 = (char *)((ulong)uVar9 * 2);
              if ((int)pcVar11 <= (int)uVar9) goto LAB_001ca903;
              pcVar16 = p->pArray;
              if (pcVar16 == (char *)0x0) {
                pcVar16 = pcVar11;
                pcVar12 = (char *)malloc((size_t)pcVar11);
                iVar8 = (int)pcVar16;
              }
              else {
                pcVar10 = pcVar11;
                pcVar12 = (char *)realloc(pcVar16,(size_t)pcVar11);
                iVar8 = (int)pcVar16;
              }
            }
            p->pArray = pcVar12;
            p->nCap = (int)pcVar11;
          }
LAB_001ca903:
          iVar6 = p->nSize;
          p->nSize = iVar6 + 1;
          p->pArray[iVar6] = '\0';
          if (iVar7 == 5) {
            Wlc_StdinProcessSmt(pAbc,p->pArray);
            goto LAB_001cab17;
          }
          iVar6 = Abc_FrameIsBridgeMode();
          if (iVar6 == 0) {
            if (iVar7 - 3U < 2) goto LAB_001ca968;
            if (iVar7 != 0) {
              if (0 < p->nSize) {
                Abc_Print(iVar8,pcVar10,p->pArray);
              }
              goto LAB_001ca955;
            }
          }
          else {
            pGVar13 = Gia_ManFromBridge((FILE *)_stdin,(Vec_Int_t **)0x0);
            pAbc->pGia = pGVar13;
LAB_001ca955:
            if (iVar7 != 0) {
LAB_001ca968:
              pAbc->fBatchMode = 1;
              if (argc == globalUtilOptind) {
LAB_001ca9c6:
                pcVar10 = (char *)0x0;
              }
              else {
                if (argc - globalUtilOptind != 1) {
                  Abc_UtilsPrintUsage(pAbc,*argv);
                  goto LAB_001ca9c6;
                }
                pcVar10 = argv[globalUtilOptind];
                bVar3 = true;
              }
              if (bVar2) {
                Abc_UtilsSource(pAbc);
              }
              if ((bVar3) && (pcVar10 != (char *)0x0)) {
                sprintf((char *)local_8038,"%s %s",local_8428,pcVar10);
                iVar8 = Cmd_CommandExecute(pAbc,(char *)local_8038);
                if (iVar8 == 0) goto LAB_001caa1d;
              }
              else {
LAB_001caa1d:
                iVar8 = Cmd_CommandExecute(pAbc,p->pArray);
                if ((local_8820 != (char *)0x0 && bVar4) && iVar8 + 1U < 2) {
                  sprintf((char *)local_8038,"%s %s",local_8818,local_8820);
                  Cmd_CommandExecute(pAbc,(char *)local_8038);
                }
              }
              if ((iVar7 != 4) && (iVar7 != 2)) {
                if (p->pArray != (char *)0x0) {
                  free(p->pArray);
                  p->pArray = (char *)0x0;
                }
                free(p);
                goto LAB_001cab17;
              }
              pAbc->fBatchMode = 0;
            }
          }
          if (p->pArray != (char *)0x0) {
            free(p->pArray);
            p->pArray = (char *)0x0;
          }
          free(p);
          Abc_UtilsPrintHello(pAbc);
          Cmd_HistoryPrint(pAbc,10);
          if (bVar2) {
            Abc_UtilsSource(pAbc);
          }
          goto LAB_001caad3;
        }
        goto switchD_001c9df6_caseD_65;
      }
      if (0 < p->nSize) {
        lVar18 = 0;
        do {
          cVar1 = " ; "[lVar18];
          uVar9 = p->nCap;
          if (p->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(p->pArray,0x10);
              }
              sVar14 = 0x10;
            }
            else {
              sVar14 = (ulong)uVar9 * 2;
              if ((int)sVar14 <= (int)uVar9) goto LAB_001c9f44;
              if (p->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar14);
              }
              else {
                pcVar10 = (char *)realloc(p->pArray,sVar14);
              }
            }
            p->pArray = pcVar10;
            p->nCap = (int)sVar14;
          }
LAB_001c9f44:
          iVar7 = p->nSize;
          p->nSize = iVar7 + 1;
          p->pArray[iVar7] = cVar1;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
      }
      pcVar10 = globalUtilOptarg;
      sVar14 = strlen(globalUtilOptarg);
      iVar7 = 2;
      if (0 < (int)(uint)sVar14) {
        uVar15 = 0;
        do {
          cVar1 = pcVar10[uVar15];
          uVar9 = p->nCap;
          if (p->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(0x10);
              }
              else {
                pcVar11 = (char *)realloc(p->pArray,0x10);
              }
              sVar17 = 0x10;
            }
            else {
              sVar17 = (ulong)uVar9 * 2;
              if ((int)sVar17 <= (int)uVar9) goto LAB_001ca07d;
              if (p->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(sVar17);
              }
              else {
                pcVar11 = (char *)realloc(p->pArray,sVar17);
              }
            }
            p->pArray = pcVar11;
            p->nCap = (int)sVar17;
          }
LAB_001ca07d:
          iVar8 = p->nSize;
          p->nSize = iVar8 + 1;
          p->pArray[iVar8] = cVar1;
          uVar15 = uVar15 + 1;
        } while (((uint)sVar14 & 0x7fffffff) != uVar15);
      }
    }
    else if (iVar6 == 0x46) {
      if (0 < p->nSize) {
        lVar18 = 0;
        do {
          cVar1 = " ; "[lVar18];
          uVar9 = p->nCap;
          if (p->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(p->pArray,0x10);
              }
              sVar14 = 0x10;
            }
            else {
              sVar14 = (ulong)uVar9 * 2;
              if ((int)sVar14 <= (int)uVar9) goto LAB_001ca11f;
              if (p->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar14);
              }
              else {
                pcVar10 = (char *)realloc(p->pArray,sVar14);
              }
            }
            p->pArray = pcVar10;
            p->nCap = (int)sVar14;
          }
LAB_001ca11f:
          iVar7 = p->nSize;
          p->nSize = iVar7 + 1;
          p->pArray[iVar7] = cVar1;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
      }
      Vec_StrPrintF(p,"source -x %s",globalUtilOptarg);
      iVar7 = 1;
    }
    else {
      if (iVar6 != 0x51) goto switchD_001c9df6_caseD_65;
      if (0 < p->nSize) {
        lVar18 = 0;
        do {
          cVar1 = " ; "[lVar18];
          uVar9 = p->nCap;
          if (p->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(p->pArray,0x10);
              }
              sVar14 = 0x10;
            }
            else {
              sVar14 = (ulong)uVar9 * 2;
              if ((int)sVar14 <= (int)uVar9) goto LAB_001c9e97;
              if (p->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar14);
              }
              else {
                pcVar10 = (char *)realloc(p->pArray,sVar14);
              }
            }
            p->pArray = pcVar10;
            p->nCap = (int)sVar14;
          }
LAB_001c9e97:
          iVar7 = p->nSize;
          p->nSize = iVar7 + 1;
          p->pArray[iVar7] = cVar1;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
      }
      pcVar10 = globalUtilOptarg;
      sVar14 = strlen(globalUtilOptarg);
      iVar7 = 4;
      if (0 < (int)(uint)sVar14) {
        uVar15 = 0;
        do {
          cVar1 = pcVar10[uVar15];
          uVar9 = p->nCap;
          if (p->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(0x10);
              }
              else {
                pcVar11 = (char *)realloc(p->pArray,0x10);
              }
              sVar17 = 0x10;
            }
            else {
              sVar17 = (ulong)uVar9 * 2;
              if ((int)sVar17 <= (int)uVar9) goto LAB_001ca20b;
              if (p->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(sVar17);
              }
              else {
                pcVar11 = (char *)realloc(p->pArray,sVar17);
              }
            }
            p->pArray = pcVar11;
            p->nCap = (int)sVar17;
          }
LAB_001ca20b:
          iVar8 = p->nSize;
          p->nSize = iVar8 + 1;
          p->pArray[iVar8] = cVar1;
          uVar15 = uVar15 + 1;
        } while (((uint)sVar14 & 0x7fffffff) != uVar15);
      }
    }
  }
  bVar5 = false;
  switch(iVar6) {
  case 0x62:
    Abc_FrameSetBridgeMode();
    bVar5 = bVar2;
    goto switchD_001c9df6_caseD_73;
  case 99:
    if (0 < p->nSize) {
      lVar18 = 0;
      do {
        cVar1 = " ; "[lVar18];
        uVar9 = p->nCap;
        if (p->nSize == uVar9) {
          if ((int)uVar9 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar10 = (char *)malloc(0x10);
            }
            else {
              pcVar10 = (char *)realloc(p->pArray,0x10);
            }
            sVar14 = 0x10;
          }
          else {
            sVar14 = (ulong)uVar9 * 2;
            if ((int)sVar14 <= (int)uVar9) goto LAB_001ca4f5;
            if (p->pArray == (char *)0x0) {
              pcVar10 = (char *)malloc(sVar14);
            }
            else {
              pcVar10 = (char *)realloc(p->pArray,sVar14);
            }
          }
          p->pArray = pcVar10;
          p->nCap = (int)sVar14;
        }
LAB_001ca4f5:
        iVar7 = p->nSize;
        p->nSize = iVar7 + 1;
        p->pArray[iVar7] = cVar1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
    }
    pcVar10 = globalUtilOptarg;
    sVar14 = strlen(globalUtilOptarg);
    iVar7 = 1;
    bVar5 = bVar2;
    if (0 < (int)(uint)sVar14) {
      uVar15 = 0;
      do {
        cVar1 = pcVar10[uVar15];
        uVar9 = p->nCap;
        if (p->nSize == uVar9) {
          if ((int)uVar9 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(0x10);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,0x10);
            }
            sVar17 = 0x10;
          }
          else {
            sVar17 = (ulong)uVar9 * 2;
            if ((int)sVar17 <= (int)uVar9) goto LAB_001ca5ad;
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(sVar17);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,sVar17);
            }
          }
          p->pArray = pcVar11;
          p->nCap = (int)sVar17;
        }
LAB_001ca5ad:
        iVar8 = p->nSize;
        p->nSize = iVar8 + 1;
        p->pArray[iVar8] = cVar1;
        uVar15 = uVar15 + 1;
      } while (((uint)sVar14 & 0x7fffffff) != uVar15);
    }
    goto switchD_001c9df6_caseD_73;
  case 100:
    enable_dbg_outs._0_1_ = (byte)enable_dbg_outs ^ 1;
    bVar5 = bVar2;
    goto switchD_001c9df6_caseD_73;
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x70:
  case 0x72:
  case 0x75:
  case 0x76:
  case 0x77:
    goto switchD_001c9df6_caseD_65;
  case 0x66:
    if (0 < p->nSize) {
      lVar18 = 0;
      do {
        cVar1 = " ; "[lVar18];
        uVar9 = p->nCap;
        if (p->nSize == uVar9) {
          if ((int)uVar9 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar10 = (char *)malloc(0x10);
            }
            else {
              pcVar10 = (char *)realloc(p->pArray,0x10);
            }
            sVar14 = 0x10;
          }
          else {
            sVar14 = (ulong)uVar9 * 2;
            if ((int)sVar14 <= (int)uVar9) goto LAB_001ca650;
            if (p->pArray == (char *)0x0) {
              pcVar10 = (char *)malloc(sVar14);
            }
            else {
              pcVar10 = (char *)realloc(p->pArray,sVar14);
            }
          }
          p->pArray = pcVar10;
          p->nCap = (int)sVar14;
        }
LAB_001ca650:
        iVar7 = p->nSize;
        p->nSize = iVar7 + 1;
        p->pArray[iVar7] = cVar1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
    }
    Vec_StrPrintF(p,"source %s",globalUtilOptarg);
    iVar7 = 1;
    bVar5 = bVar2;
    goto switchD_001c9df6_caseD_73;
  case 0x6c:
    uVar9 = atoi(globalUtilOptarg);
    printf("Limiting time to %d seconds\n",(ulong)uVar9);
    __resource = RLIMIT_CPU;
    local_8038[0].rlim_max = (long)(int)uVar9;
    break;
  case 0x6d:
    uVar9 = atoi(globalUtilOptarg);
    printf("Limiting memory use to %d MB\n",(ulong)uVar9);
    __resource = RLIMIT_AS;
    local_8038[0].rlim_max = (long)(int)uVar9 << 0x14;
    break;
  case 0x6f:
    local_8820 = globalUtilOptarg;
    bVar4 = true;
    bVar5 = bVar2;
    goto switchD_001c9df6_caseD_73;
  case 0x71:
    if (0 < p->nSize) {
      lVar18 = 0;
      do {
        cVar1 = " ; "[lVar18];
        uVar9 = p->nCap;
        if (p->nSize == uVar9) {
          if ((int)uVar9 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar10 = (char *)malloc(0x10);
            }
            else {
              pcVar10 = (char *)realloc(p->pArray,0x10);
            }
            sVar14 = 0x10;
          }
          else {
            sVar14 = (ulong)uVar9 * 2;
            if ((int)sVar14 <= (int)uVar9) goto LAB_001ca2ae;
            if (p->pArray == (char *)0x0) {
              pcVar10 = (char *)malloc(sVar14);
            }
            else {
              pcVar10 = (char *)realloc(p->pArray,sVar14);
            }
          }
          p->pArray = pcVar10;
          p->nCap = (int)sVar14;
        }
LAB_001ca2ae:
        iVar7 = p->nSize;
        p->nSize = iVar7 + 1;
        p->pArray[iVar7] = cVar1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
    }
    pcVar10 = globalUtilOptarg;
    sVar14 = strlen(globalUtilOptarg);
    iVar7 = 3;
    bVar5 = bVar2;
    if (0 < (int)(uint)sVar14) {
      uVar15 = 0;
      do {
        cVar1 = pcVar10[uVar15];
        uVar9 = p->nCap;
        if (p->nSize == uVar9) {
          if ((int)uVar9 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(0x10);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,0x10);
            }
            sVar17 = 0x10;
          }
          else {
            sVar17 = (ulong)uVar9 * 2;
            if ((int)sVar17 <= (int)uVar9) goto LAB_001ca366;
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(sVar17);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,sVar17);
            }
          }
          p->pArray = pcVar11;
          p->nCap = (int)sVar17;
        }
LAB_001ca366:
        iVar8 = p->nSize;
        p->nSize = iVar8 + 1;
        p->pArray[iVar8] = cVar1;
        uVar15 = uVar15 + 1;
      } while (((uint)sVar14 & 0x7fffffff) != uVar15);
    }
  case 0x73:
    goto switchD_001c9df6_caseD_73;
  case 0x74:
    iVar7 = TypeCheck(pAbc,globalUtilOptarg);
    pcVar10 = globalUtilOptarg;
    if (iVar7 == 0) goto switchD_001c9df6_caseD_65;
    iVar8 = strcmp(globalUtilOptarg,"none");
    iVar7 = 1;
    bVar5 = bVar2;
    if (iVar8 != 0) {
      sprintf(local_8428,"read_%s",pcVar10);
      bVar3 = true;
      goto LAB_001ca44a;
    }
    goto switchD_001c9df6_caseD_73;
  case 0x78:
    iVar7 = 1;
    bVar3 = false;
    bVar4 = false;
    bVar5 = bVar2;
    goto switchD_001c9df6_caseD_73;
  default:
    if (iVar6 == 0x53) {
      if (0 < p->nSize) {
        lVar18 = 0;
        do {
          cVar1 = " ; "[lVar18];
          uVar9 = p->nCap;
          if (p->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(p->pArray,0x10);
              }
              sVar14 = 0x10;
            }
            else {
              sVar14 = (ulong)uVar9 * 2;
              if ((int)sVar14 <= (int)uVar9) goto LAB_001ca785;
              if (p->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar14);
              }
              else {
                pcVar10 = (char *)realloc(p->pArray,sVar14);
              }
            }
            p->pArray = pcVar10;
            p->nCap = (int)sVar14;
          }
LAB_001ca785:
          iVar7 = p->nSize;
          p->nSize = iVar7 + 1;
          p->pArray[iVar7] = cVar1;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
      }
      pcVar10 = globalUtilOptarg;
      sVar14 = strlen(globalUtilOptarg);
      iVar7 = 5;
      bVar5 = bVar2;
      if (0 < (int)(uint)sVar14) {
        uVar15 = 0;
        do {
          cVar1 = pcVar10[uVar15];
          uVar9 = p->nCap;
          if (p->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(0x10);
              }
              else {
                pcVar11 = (char *)realloc(p->pArray,0x10);
              }
              sVar17 = 0x10;
            }
            else {
              sVar17 = (ulong)uVar9 * 2;
              if ((int)sVar17 <= (int)uVar9) goto LAB_001ca83d;
              if (p->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(sVar17);
              }
              else {
                pcVar11 = (char *)realloc(p->pArray,sVar17);
              }
            }
            p->pArray = pcVar11;
            p->nCap = (int)sVar17;
          }
LAB_001ca83d:
          iVar8 = p->nSize;
          p->nSize = iVar8 + 1;
          p->pArray[iVar8] = cVar1;
          uVar15 = uVar15 + 1;
        } while (((uint)sVar14 & 0x7fffffff) != uVar15);
      }
    }
    else {
      if ((iVar6 != 0x54) ||
         (iVar7 = TypeCheck(pAbc,globalUtilOptarg), pcVar10 = globalUtilOptarg, iVar7 == 0))
      goto switchD_001c9df6_caseD_65;
      iVar8 = strcmp(globalUtilOptarg,"none");
      iVar7 = 1;
      bVar5 = bVar2;
      if (iVar8 != 0) {
        sprintf(local_8818,"write_%s",pcVar10);
        bVar4 = true;
LAB_001ca44a:
        iVar7 = 1;
        bVar5 = bVar2;
      }
    }
    goto switchD_001c9df6_caseD_73;
  }
  local_8038[0].rlim_cur = local_8038[0].rlim_max;
  setrlimit(__resource,local_8038);
  bVar5 = bVar2;
  goto switchD_001c9df6_caseD_73;
switchD_001c9df6_caseD_65:
  Abc_UtilsPrintHello(pAbc);
  Abc_UtilsPrintUsage(pAbc,*argv);
  return 1;
  while( true ) {
    pcVar10 = Abc_UtilsGetUsersInput(pAbc);
    uVar9 = Cmd_CommandExecute(pAbc,pcVar10);
    if (0xfffffffd < uVar9) break;
LAB_001caad3:
    iVar7 = feof(_stdin);
    if (iVar7 != 0) break;
  }
LAB_001cab17:
  Abc_Stop();
  return 0;
}

Assistant:

int Abc_RealMain( int argc, char * argv[] )
{
    Abc_Frame_t * pAbc;
    Vec_Str_t* sCommandUsr = Vec_StrAlloc(1000);
    char sCommandTmp[ABC_MAX_STR], sReadCmd[1000], sWriteCmd[1000];
    const char * sOutFile, * sInFile;
    char * sCommand;
    int  fStatus = 0;
    int c, fInitSource, fInitRead, fFinalWrite;

    enum {
        INTERACTIVE, // interactive mode
        BATCH, // batch mode, run a command and quit
        BATCH_THEN_INTERACTIVE, // run a command, then back to interactive mode
        BATCH_QUIET, // as in batch mode, but don't echo the command
        BATCH_QUIET_THEN_INTERACTIVE, // as in batch then interactive mode, but don't echo the command
        BATCH_SMT // special batch mode, which expends SMTLIB problem via stdin
    } fBatch;

    // added to detect memory leaks
    // watch for {,,msvcrtd.dll}*__p__crtBreakAlloc()
    // (http://support.microsoft.com/kb/151585)
#if defined(_DEBUG) && defined(_MSC_VER)
    _CrtSetDbgFlag( _CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF );
#endif

    // get global frame (singleton pattern)
    // will be initialized on first call
    pAbc = Abc_FrameGetGlobalFrame();
    pAbc->sBinary = argv[0];

    // default options
    fBatch      = INTERACTIVE;
    fInitSource = 1;
    fInitRead   = 0;
    fFinalWrite = 0;
    sInFile = sOutFile = NULL;
    sprintf( sReadCmd,  "read"  );
    sprintf( sWriteCmd, "write" );

    Extra_UtilGetoptReset();
    while ((c = Extra_UtilGetopt(argc, argv, "dm:l:c:q:C:Q:S:hf:F:o:st:T:xb")) != EOF) {
        switch(c) {

            case 'd':                                          
                enable_dbg_outs ^= 1;                            
                break;                                          

            case 'm': {
#if !defined(WIN32) && !defined(ABC_NO_RLIMIT)
                int maxMb = atoi(globalUtilOptarg);             
                printf("Limiting memory use to %d MB\n", maxMb);
                struct rlimit limit = {                         
                    maxMb * (1llu << 20), /* soft limit */      
                    maxMb * (1llu << 20)  /* hard limit */      
                };                                              
                setrlimit(RLIMIT_AS, &limit);                   
#endif
                break; 
            }                                         
            case 'l': {
#if !defined(WIN32) && !defined(ABC_NO_RLIMIT)
                rlim_t maxTime = atoi(globalUtilOptarg);           
                printf("Limiting time to %d seconds\n", (int)maxTime);
                struct rlimit limit = {                         
                    maxTime,             /* soft limit */       
                    maxTime              /* hard limit */       
                };                                              
                setrlimit(RLIMIT_CPU, &limit);                  
#endif
                break; 
            }                                         
            case 'c':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'q':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_QUIET;
                break;

            case 'Q':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_QUIET_THEN_INTERACTIVE;
                break;

            case 'C':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_THEN_INTERACTIVE;
                break;

            case 'S':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_SMT;
                break;

            case 'f':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrPrintF(sCommandUsr, "source %s", globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'F':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrPrintF(sCommandUsr, "source -x %s", globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'h':
                goto usage;
                break;

            case 'o':
                sOutFile = globalUtilOptarg;
                fFinalWrite = 1;
                break;

            case 's':
                fInitSource = 0;
                break;

            case 't':
                if ( TypeCheck( pAbc, globalUtilOptarg ) )
                {
                    if ( (!strcmp(globalUtilOptarg, "none")) == 0 )
                    {
                        fInitRead = 1;
                        sprintf( sReadCmd, "read_%s", globalUtilOptarg );
                    }
                }
                else {
                    goto usage;
                }
                fBatch = BATCH;
                break;

            case 'T':
                if ( TypeCheck( pAbc, globalUtilOptarg ) )
                {
                    if ( (!strcmp(globalUtilOptarg, "none")) == 0)
                    {
                        fFinalWrite = 1;
                        sprintf( sWriteCmd, "write_%s", globalUtilOptarg);
                    }
                }
                else {
                    goto usage;
                }
                fBatch = BATCH;
                break;

            case 'x':
                fFinalWrite = 0;
                fInitRead   = 0;
                fBatch = BATCH;
                break;

            case 'b':
                Abc_FrameSetBridgeMode();
                break;

            default:
                goto usage;
        }
    }

    Vec_StrPush(sCommandUsr, '\0');

    if ( fBatch == BATCH_SMT )
    {
        Wlc_StdinProcessSmt( pAbc, Vec_StrArray(sCommandUsr) );
        Abc_Stop();
        return 0;
    }

    if ( Abc_FrameIsBridgeMode() )
    {
        extern Gia_Man_t * Gia_ManFromBridge( FILE * pFile, Vec_Int_t ** pvInit );
        pAbc->pGia = Gia_ManFromBridge( stdin, NULL );
    }
    else if ( fBatch!=INTERACTIVE && fBatch!=BATCH_QUIET && fBatch!=BATCH_QUIET_THEN_INTERACTIVE && Vec_StrSize(sCommandUsr)>0 )
        Abc_Print( 1, "ABC command line: \"%s\".\n\n", Vec_StrArray(sCommandUsr) );

    if ( fBatch!=INTERACTIVE )
    {
        pAbc->fBatchMode = 1;

        if (argc - globalUtilOptind == 0)
        {
            sInFile = NULL;
        }
        else if (argc - globalUtilOptind == 1)
        {
            fInitRead = 1;
            sInFile = argv[globalUtilOptind];
        }
        else
        {
            Abc_UtilsPrintUsage( pAbc, argv[0] );
        }

        // source the resource file
        if ( fInitSource )
        {
            Abc_UtilsSource( pAbc );
        }

        fStatus = 0;
        if ( fInitRead && sInFile )
        {
            sprintf( sCommandTmp, "%s %s", sReadCmd, sInFile );
            fStatus = Cmd_CommandExecute( pAbc, sCommandTmp );
        }

        if ( fStatus == 0 )
        {
            /* cmd line contains `source <file>' */
            fStatus = Cmd_CommandExecute( pAbc, Vec_StrArray(sCommandUsr) );
            if ( (fStatus == 0 || fStatus == -1) && fFinalWrite && sOutFile )
            {
                sprintf( sCommandTmp, "%s %s", sWriteCmd, sOutFile );
                fStatus = Cmd_CommandExecute( pAbc, sCommandTmp );
            }
        }

        if (fBatch == BATCH_THEN_INTERACTIVE || fBatch == BATCH_QUIET_THEN_INTERACTIVE){
            fBatch = INTERACTIVE;
            pAbc->fBatchMode = 0;
        }
    }

    Vec_StrFreeP(&sCommandUsr);

    if ( fBatch==INTERACTIVE )
    {
        // start interactive mode

        // print the hello line
        Abc_UtilsPrintHello( pAbc );
        // print history of the recent commands
        Cmd_HistoryPrint( pAbc, 10 );

        // source the resource file
        if ( fInitSource )
        {
            Abc_UtilsSource( pAbc );
        }

        // execute commands given by the user
        while ( !feof(stdin) )
        {
            // print command line prompt and
            // get the command from the user
            sCommand = Abc_UtilsGetUsersInput( pAbc );

            // execute the user's command
            fStatus = Cmd_CommandExecute( pAbc, sCommand );

            // stop if the user quitted or an error occurred
            if ( fStatus == -1 || fStatus == -2 )
                break;
        }
    }

    // if the memory should be freed, quit packages
//    if ( fStatus < 0 ) 
    {
        Abc_Stop();
    }
    return 0;

usage:
    Abc_UtilsPrintHello( pAbc );
    Abc_UtilsPrintUsage( pAbc, argv[0] );
    return 1;
}